

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_set_i32_1d(ggml_tensor *tensor,int i,int32_t value)

{
  int in_EDX;
  int in_ESI;
  undefined4 *in_RDI;
  undefined1 auVar1 [16];
  undefined1 in_ZMM0 [64];
  
  switch(*in_RDI) {
  case 0:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb36,
            "false");
    abort();
  case 1:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb3a,
            "false");
    abort();
  case 2:
    if (*(long *)(in_RDI + 6) != 1) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb3e
              ,"tensor->nb[0] == sizeof(int8_t)");
      abort();
    }
    *(char *)(*(long *)(in_RDI + 0x24) + (long)in_ESI) = (char)in_EDX;
    break;
  case 3:
    if (*(long *)(in_RDI + 6) != 2) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb43
              ,"tensor->nb[0] == sizeof(int16_t)");
      abort();
    }
    *(short *)(*(long *)(in_RDI + 0x24) + (long)in_ESI * 2) = (short)in_EDX;
    break;
  case 4:
    if (*(long *)(in_RDI + 6) != 4) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb48
              ,"tensor->nb[0] == sizeof(int32_t)");
      abort();
    }
    *(int *)(*(long *)(in_RDI + 0x24) + (long)in_ESI * 4) = in_EDX;
    break;
  case 5:
    if (*(long *)(in_RDI + 6) != 2) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb4d
              ,"tensor->nb[0] == sizeof(ggml_fp16_t)");
      abort();
    }
    auVar1._0_4_ = (float)in_EDX;
    auVar1._4_12_ = in_ZMM0._4_12_;
    auVar1 = vblendps_avx(ZEXT816(0) << 0x40,auVar1,1);
    auVar1 = vcvtps2ph_f16c(auVar1,0);
    *(short *)(*(long *)(in_RDI + 0x24) + (long)in_ESI * 2) = auVar1._0_2_;
    break;
  case 6:
    if (*(long *)(in_RDI + 6) != 4) {
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb52
              ,"tensor->nb[0] == sizeof(float)");
      abort();
    }
    *(float *)(*(long *)(in_RDI + 0x24) + (long)in_ESI * 4) = (float)in_EDX;
    break;
  case 7:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xb57,
            "false");
    abort();
  }
  return;
}

Assistant:

void ggml_set_i32_1d(const struct ggml_tensor * tensor, int i, int32_t value) {
    switch (tensor->type) {
        case GGML_TYPE_Q4_0:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_Q4_1:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_I8:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int8_t));
                ((int8_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_I16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int16_t));
                ((int16_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_I32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int32_t));
                ((int32_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_F16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(ggml_fp16_t));
                ((ggml_fp16_t *)(tensor->data))[i] = GGML_FP32_TO_FP16(value);
            } break;
        case GGML_TYPE_F32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(float));
                ((float *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_COUNT:
            {
                GGML_ASSERT(false);
            } break;
    }
}